

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void captureCursor(_GLFWwindow *window)

{
  long in_RDI;
  
  (*_glfw.x11.xlib.GrabPointer)
            (_glfw.x11.display,*(Window *)(in_RDI + 0x4e0),1,0x4c,1,1,*(Window *)(in_RDI + 0x4e0),0,
             0);
  return;
}

Assistant:

static void captureCursor(_GLFWwindow* window)
{
    XGrabPointer(_glfw.x11.display, window->x11.handle, True,
                 ButtonPressMask | ButtonReleaseMask | PointerMotionMask,
                 GrabModeAsync, GrabModeAsync,
                 window->x11.handle,
                 None,
                 CurrentTime);
}